

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_PitchDetector.cpp
# Opt level: O3

int PitchDetector::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  UnityAudioParameterDefinition *pUVar1;
  
  pUVar1 = (UnityAudioParameterDefinition *)operator_new__(0x200);
  definition->paramdefs = pUVar1;
  RegisterParameter(definition,"Index","",0.0,15.0,0.0,1.0,1.0,0,
                    "Determines where the pitch data is written to for access by scripts via PitchDetectorGetFreq"
                   );
  RegisterParameter(definition,"Low Cut","",0.0,4095.0,20.0,1.0,1.0,1,
                    "Low frequency cut-off for input preprocessing");
  RegisterParameter(definition,"High Cut","",0.0,4095.0,1000.0,1.0,1.0,2,
                    "High frequency cut-off for input preprocessing");
  RegisterParameter(definition,"Low Bin","",0.0,4095.0,50.0,1.0,1.0,3,
                    "Low detection bin in autocorrelation");
  RegisterParameter(definition,"High Bin","",0.0,4095.0,1500.0,1.0,1.0,4,
                    "High detection bin in autocorrelation");
  RegisterParameter(definition,"Threshold","%",0.0,1.0,0.05,1.0,1.0,5,
                    "Input signal envelope threshold above which pitch detection is attempted");
  RegisterParameter(definition,"Osc Pitch","",-48.0,48.0,0.0,1.0,1.0,6,
                    "Relative oscillator pitch in semitones");
  RegisterParameter(definition,"Monitor","%",0.0,1.0,0.5,100.0,1.0,7,
                    "Monitor mix for auditioning the pitch tracking");
  return 8;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Index", "", 0.0f, MAXINDEX - 1, 0.0f, 1.0f, 1.0f, P_INDEX, "Determines where the pitch data is written to for access by scripts via PitchDetectorGetFreq");
        RegisterParameter(definition, "Low Cut", "", 0.0f, (FFTSIZE / 2) - 1, 20, 1.0f, 1.0f, P_LOCUT, "Low frequency cut-off for input preprocessing");
        RegisterParameter(definition, "High Cut", "", 0.0f, (FFTSIZE / 2) - 1, 1000, 1.0f, 1.0f, P_HICUT, "High frequency cut-off for input preprocessing");
        RegisterParameter(definition, "Low Bin", "", 0.0f, (FFTSIZE / 2) - 1, 50, 1.0f, 1.0f, P_LOBIN, "Low detection bin in autocorrelation");
        RegisterParameter(definition, "High Bin", "", 0.0f, (FFTSIZE / 2) - 1, 1500, 1.0f, 1.0f, P_HIBIN, "High detection bin in autocorrelation");
        RegisterParameter(definition, "Threshold", "%", 0.0f, 1.0f, 0.05f, 1.0f, 1.0f, P_THR, "Input signal envelope threshold above which pitch detection is attempted");
        RegisterParameter(definition, "Osc Pitch", "", -48.0f, 48.0f, 0.0f, 1.0f, 1.0f, P_OSCPITCH, "Relative oscillator pitch in semitones");
        RegisterParameter(definition, "Monitor", "%", 0.0f, 1.0f, 0.5f, 100.0f, 1.0f, P_MONITOR, "Monitor mix for auditioning the pitch tracking");
        return numparams;
    }